

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

string * __thiscall
Catch::LegacyReporterRegistrar<Catch::XmlReporter>::ReporterFactory::getDescription_abi_cxx11_
          (string *__return_storage_ptr__,ReporterFactory *this)

{
  XmlReporter::getDescription_abi_cxx11_();
  return __return_storage_ptr__;
}

Assistant:

virtual std::string getDescription() const {
                return T::getDescription();
            }